

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

IntermediateNode *
Indexing::SubstitutionTree<Indexing::TermWithoutValue>::SListIntermediateNode::assimilate
          (IntermediateNode *orig)

{
  SListIntermediateNode *this;
  NodeIterator local_20;
  
  this = (SListIntermediateNode *)operator_new(0x28);
  SListIntermediateNode(this,(TermList)(orig->super_Node)._term._content,orig->childVar);
  (*(orig->super_Node)._vptr_Node[8])(&local_20,orig);
  SubstitutionTree<Indexing::TermWithoutValue>::IntermediateNode::loadChildren
            ((IntermediateNode *)this,&local_20);
  Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithoutValue>::Node_**>::
  ~VirtualIterator(&local_20);
  (orig->super_Node)._term._content = 2;
  (*(orig->super_Node)._vptr_Node[0xc])(orig);
  (*(orig->super_Node)._vptr_Node[1])(orig);
  return &this->super_IntermediateNode;
}

Assistant:

typename SubstitutionTree<LeafData_>::IntermediateNode* SubstitutionTree<LeafData_>::SListIntermediateNode
	::assimilate(IntermediateNode* orig)
{
  IntermediateNode* res= 0;
  // TODO refactor such that children are not copied here, and deleted at (2), but moved instead
  res = new SListIntermediateNode(orig->term(), orig->childVar);
  res->loadChildren(orig->allChildren());
  orig->makeEmpty();
  // TODO (2) see above
  delete orig;
  return res;
}